

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O0

FTexture * DDSTexture_TryCreate(FileReader *data,int lumpnum)

{
  bool bVar1;
  FDDSTexture *this;
  undefined1 local_98 [4];
  uint local_94;
  DDSURFACEDESC2 surfdesc;
  int lumpnum_local;
  FileReader *data_local;
  
  surfdesc.Caps.Reserved[1] = lumpnum;
  unique0x100000e7 = data;
  bVar1 = CheckDDS(data);
  if (!bVar1) {
    return (FTexture *)0x0;
  }
  (*(stack0xffffffffffffffe8->super_FileReaderBase)._vptr_FileReaderBase[4])
            (stack0xffffffffffffffe8,4,0);
  (*(stack0xffffffffffffffe8->super_FileReaderBase)._vptr_FileReaderBase[2])
            (stack0xffffffffffffffe8,local_98,0x7c);
  if ((surfdesc.Reserved1[10] & 4) == 0) {
    if ((surfdesc.Reserved1[10] & 0x40) == 0) {
      return (FTexture *)0x0;
    }
    if ((surfdesc.PixelFormat.Flags >> 3 == 0) || (4 < surfdesc.PixelFormat.Flags >> 3)) {
      return (FTexture *)0x0;
    }
    if (((local_94 & 8) != 0) && ((int)surfdesc.Height < 1)) {
      return (FTexture *)0x0;
    }
  }
  else {
    if ((((surfdesc.PixelFormat.Size != 0x31545844) && (surfdesc.PixelFormat.Size != 0x32545844)) &&
        (surfdesc.PixelFormat.Size != 0x33545844)) &&
       ((surfdesc.PixelFormat.Size != 0x34545844 && (surfdesc.PixelFormat.Size != 0x35545844)))) {
      return (FTexture *)0x0;
    }
    if ((local_94 & 0x80000) == 0) {
      return (FTexture *)0x0;
    }
  }
  this = (FDDSTexture *)operator_new(0x90);
  FDDSTexture::FDDSTexture(this,stack0xffffffffffffffe8,surfdesc.Caps.Reserved[1],local_98);
  return &this->super_FTexture;
}

Assistant:

FTexture *DDSTexture_TryCreate (FileReader &data, int lumpnum)
{
	union
	{
		DDSURFACEDESC2	surfdesc;
		DWORD			byteswapping[sizeof(DDSURFACEDESC2) / 4];
	};

	if (!CheckDDS(data)) return NULL;

	data.Seek (4, SEEK_SET);
	data.Read (&surfdesc, sizeof(surfdesc));

#ifdef __BIG_ENDIAN__
	// Every single element of the header is a DWORD
	for (unsigned int i = 0; i < sizeof(DDSURFACEDESC2) / 4; ++i)
	{
		byteswapping[i] = LittleLong(byteswapping[i]);
	}
	// Undo the byte swap for the pixel format
	surfdesc.PixelFormat.FourCC = LittleLong(surfdesc.PixelFormat.FourCC);
#endif

	if (surfdesc.PixelFormat.Flags & DDPF_FOURCC)
	{
		// Check for supported FourCC
		if (surfdesc.PixelFormat.FourCC != ID_DXT1 &&
			surfdesc.PixelFormat.FourCC != ID_DXT2 &&
			surfdesc.PixelFormat.FourCC != ID_DXT3 &&
			surfdesc.PixelFormat.FourCC != ID_DXT4 &&
			surfdesc.PixelFormat.FourCC != ID_DXT5)
		{
			return NULL;
		}
		if (!(surfdesc.Flags & DDSD_LINEARSIZE))
		{
			return NULL;
		}
	}
	else if (surfdesc.PixelFormat.Flags & DDPF_RGB)
	{
		if ((surfdesc.PixelFormat.RGBBitCount >> 3) < 1 ||
			(surfdesc.PixelFormat.RGBBitCount >> 3) > 4)
		{
			return NULL;
		}
		if ((surfdesc.Flags & DDSD_PITCH) && (surfdesc.Pitch <= 0))
		{
			return NULL;
		}
	}
	else
	{
		return NULL;
	}
	return new FDDSTexture (data, lumpnum, &surfdesc);
}